

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestMutualRecursionB::~TestMutualRecursionB(TestMutualRecursionB *this)

{
  TestMutualRecursionB *this_local;
  
  ~TestMutualRecursionB(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TestMutualRecursionB::~TestMutualRecursionB() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestMutualRecursionB)
  SharedDtor(*this);
}